

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Opt::Opt(Opt *this,bool *ref)

{
  shared_ptr<Catch::clara::detail::BoundFlagRef> *in_RDI;
  ParserRefImpl<Catch::clara::detail::Opt> *in_stack_ffffffffffffffd0;
  
  ::std::make_shared<Catch::clara::detail::BoundFlagRef,bool&>((bool *)in_RDI);
  ::std::shared_ptr<Catch::clara::detail::BoundRef>::
  shared_ptr<Catch::clara::detail::BoundFlagRef,void>
            ((shared_ptr<Catch::clara::detail::BoundRef> *)in_stack_ffffffffffffffd0,in_RDI);
  ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
            (in_stack_ffffffffffffffd0,(shared_ptr<Catch::clara::detail::BoundRef> *)in_RDI);
  std::shared_ptr<Catch::clara::detail::BoundRef>::~shared_ptr
            ((shared_ptr<Catch::clara::detail::BoundRef> *)0x154dbd);
  std::shared_ptr<Catch::clara::detail::BoundFlagRef>::~shared_ptr
            ((shared_ptr<Catch::clara::detail::BoundFlagRef> *)0x154dc7);
  (in_RDI->super___shared_ptr<Catch::clara::detail::BoundFlagRef,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)&PTR__Opt_00289d50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x154de2);
  return;
}

Assistant:

explicit Opt( bool &ref ) : ParserRefImpl( std::make_shared<BoundFlagRef>( ref ) ) {}